

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

EExpr * __thiscall mp::QP2PassVisitor::GetPass2Result(QP2PassVisitor *this)

{
  bool bVar1;
  reference piVar2;
  reference pvVar3;
  size_type sVar4;
  QuadTerms *coef;
  uint *puVar5;
  long in_RSI;
  AlgebraicExpression<mp::QuadAndLinTerms> *in_RDI;
  QuadTerms *this_00;
  double c_1;
  size_t j;
  size_t i;
  value_type c;
  int vl;
  iterator __end1;
  iterator __begin1;
  SmallVec<int,_64> *__range1;
  EExpr *result;
  uint in_stack_ffffffffffffff28;
  uint in_stack_ffffffffffffff2c;
  TMatrix<double,_16U> *in_stack_ffffffffffffff30;
  double in_stack_ffffffffffffff38;
  LinTerms *in_stack_ffffffffffffff40;
  ulong local_60;
  ulong local_58;
  small_vector_iterator<int_*,_long> local_38;
  long local_30;
  undefined1 local_11;
  
  *(undefined4 *)(in_RSI + 0x10) = 0;
  local_11 = 0;
  EExpr::EExpr((EExpr *)0x506ed5);
  AlgebraicExpression<mp::QuadAndLinTerms>::constant_term
            (in_RDI,(double)*(longdouble *)(in_RSI + 0x2b0));
  QuadAndLinTerms::GetLinTerms(&in_RDI->super_QuadAndLinTerms);
  gch::small_vector<int,_64U,_std::allocator<int>_>::size
            ((small_vector<int,_64U,_std::allocator<int>_> *)0x506f15);
  LinTerms::reserve((LinTerms *)in_stack_ffffffffffffff30,
                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  local_30 = in_RSI + 0x70;
  local_38.m_ptr =
       (int *)gch::small_vector<int,_64U,_std::allocator<int>_>::begin
                        ((small_vector<int,_64U,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  gch::small_vector<int,_64U,_std::allocator<int>_>::end
            ((small_vector<int,_64U,_std::allocator<int>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  while (bVar1 = gch::operator!=((small_vector_iterator<int_*,_long> *)in_stack_ffffffffffffff30,
                                 (small_vector_iterator<int_*,_long> *)
                                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)),
        bVar1) {
    piVar2 = gch::small_vector_iterator<int_*,_long>::operator*
                       ((small_vector_iterator<int_*,_long> *)0x506f8a);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RSI + 0x2c0),(long)*piVar2);
    if ((*pvVar3 != 0.0) || (NAN(*pvVar3))) {
      QuadAndLinTerms::GetLinTerms(&in_RDI->super_QuadAndLinTerms);
      LinTerms::add_term(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                         (int)((ulong)in_stack_ffffffffffffff30 >> 0x20));
    }
    gch::small_vector_iterator<int_*,_long>::operator++(&local_38);
  }
  for (local_58 = 0;
      sVar4 = gch::small_vector<int,_64U,_std::allocator<int>_>::size
                        ((small_vector<int,_64U,_std::allocator<int>_> *)0x50705f), local_58 < sVar4
      ; local_58 = local_58 + 1) {
    for (local_60 = local_58;
        sVar4 = gch::small_vector<int,_64U,_std::allocator<int>_>::size
                          ((small_vector<int,_64U,_std::allocator<int>_> *)0x507098),
        local_60 < sVar4; local_60 = local_60 + 1) {
      this_00 = (QuadTerms *)
                TMatrix<double,_16U>::operator()
                          (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c,
                           in_stack_ffffffffffffff28);
      if (((double)this_00 != 0.0) || (NAN((double)this_00))) {
        coef = QuadAndLinTerms::GetQPTerms(&in_RDI->super_QuadAndLinTerms);
        puVar5 = (uint *)gch::small_vector<int,_64U,_std::allocator<int>_>::operator[]
                                   ((small_vector<int,_64U,_std::allocator<int>_> *)
                                    in_stack_ffffffffffffff30,
                                    CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff2c = *puVar5;
        in_stack_ffffffffffffff30 =
             (TMatrix<double,_16U> *)
             gch::small_vector<int,_64U,_std::allocator<int>_>::operator[]
                       ((small_vector<int,_64U,_std::allocator<int>_> *)in_stack_ffffffffffffff30,
                        CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        QuadTerms::add_term(this_00,(double)coef,(int)((ulong)puVar5 >> 0x20),(int)puVar5);
      }
    }
  }
  return (EExpr *)in_RDI;
}

Assistant:

EExpr QP2PassVisitor::GetPass2Result() {
  assert(2==pass_);
  pass_ = 0;          // to indicate the run is finished
  EExpr result;
  result.constant_term(const_term_);
  result.GetLinTerms().reserve(vars_lin_.size());
  for (auto vl: vars_lin_)
    if (auto c = coefs_lin_dense_[vl])
      result.GetLinTerms().add_term(c, vl);
  assert(result.GetLinTerms().is_sorted());
  for (std::size_t i=0; i<vars_qp_.size(); ++i)
    for (std::size_t j=i; j<vars_qp_.size(); ++j)
      if (auto c = coefs_qp_(i, j))
        result.GetQPTerms().add_term(
            c, vars_qp_[i], vars_qp_[j]);
  assert(result.GetQPTerms().is_sorted());
  return result;
}